

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::shiftUp(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  long lVar1;
  size_t sVar2;
  
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>_>
  ::pair(&this->mKeyVals[startIdx].mData,&this->mKeyVals[startIdx - 1].mData);
  lVar1 = startIdx * 0x28 + -0x50;
  for (sVar2 = startIdx - 1; insertion_idx != sVar2; sVar2 = sVar2 - 1) {
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>_>
    ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>_>
                 *)((long)&this->mKeyVals[1].mData.first._M_dataplus._M_p + lVar1),
                (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>_>
                 *)((long)&(this->mKeyVals->mData).first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  }
  for (; insertion_idx != startIdx; startIdx = startIdx - 1) {
    this->mInfo[startIdx] = this->mInfo[startIdx - 1] + (char)this->mInfoInc;
    if (0xff < (uint)this->mInfo[startIdx] + this->mInfoInc) {
      this->mMaxNumElementsAllowed = 0;
    }
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }